

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Tags::Tag::Clear(Tag *this)

{
  SimpleTag *pSVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->m_simple_tags_count;
  while (0 < iVar2) {
    this->m_simple_tags_count = iVar2 - 1U;
    SimpleTag::Clear(this->m_simple_tags + (iVar2 - 1U));
    iVar2 = this->m_simple_tags_count;
  }
  pSVar1 = this->m_simple_tags;
  if (pSVar1 != (SimpleTag *)0x0) {
    if (pSVar1[-1].m_tag_string != (char *)0x0) {
      lVar3 = (long)pSVar1[-1].m_tag_string << 4;
      do {
        SimpleTag::~SimpleTag((SimpleTag *)((long)&pSVar1[-1].m_tag_name + lVar3));
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
    }
    operator_delete__(&pSVar1[-1].m_tag_string);
  }
  this->m_simple_tags = (SimpleTag *)0x0;
  this->m_simple_tags_size = 0;
  return;
}

Assistant:

void Tags::Tag::Clear() {
  while (m_simple_tags_count > 0) {
    SimpleTag& d = m_simple_tags[--m_simple_tags_count];
    d.Clear();
  }

  delete[] m_simple_tags;
  m_simple_tags = NULL;

  m_simple_tags_size = 0;
}